

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::MarkFinished(cmCTestMultiProcessHandler *this)

{
  string local_50;
  undefined1 local_30 [8];
  string fname;
  cmCTestMultiProcessHandler *this_local;
  
  fname.field_2._8_8_ = this;
  cmCTest::GetBinaryDir_abi_cxx11_(&local_50,this->CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"/Testing/Temporary/CTestCheckpoint.txt");
  std::__cxx11::string::~string((string *)&local_50);
  cmsys::SystemTools::RemoveFile((string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::MarkFinished()
{
  std::string fname = this->CTest->GetBinaryDir()
    + "/Testing/Temporary/CTestCheckpoint.txt";
  cmSystemTools::RemoveFile(fname);
}